

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O1

aiColor4D __thiscall Assimp::M3DImporter::mkColor(M3DImporter *this,uint32_t c)

{
  aiColor4D aVar1;
  
  aVar1.b = (float)(c >> 0x10 & 0xff) / 255.0;
  aVar1.a = (float)(c >> 0x18) / 255.0;
  aVar1.r = (float)(c & 0xff) / 255.0;
  aVar1.g = (float)(c >> 8 & 0xff) / 255.0;
  return aVar1;
}

Assistant:

aiColor4D M3DImporter::mkColor(uint32_t c) {
	aiColor4D color;
	color.a = ((float)((c >> 24) & 0xff)) / 255;
	color.b = ((float)((c >> 16) & 0xff)) / 255;
	color.g = ((float)((c >> 8) & 0xff)) / 255;
	color.r = ((float)((c >> 0) & 0xff)) / 255;
	return color;
}